

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_create_function16
              (sqlite3 *db,void *zFunctionName,int nArg,int eTextRep,void *p,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
              _func_void_sqlite3_context_ptr *xFinal)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  sqlite3 *in_RDI;
  void *in_R8;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_R9;
  sqlite3 *in_stack_00000008;
  sqlite3 *in_stack_00000010;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_stack_00000020;
  _func_void_sqlite3_context_ptr *in_stack_00000028;
  char *zFunc8;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_stack_00000038;
  int rc;
  undefined8 in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  sqlite3 *in_stack_ffffffffffffffb0;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14b8c3);
  sqlite3Utf16to8(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                  (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                  (u8)((ulong)in_stack_ffffffffffffffa0 >> 0x18));
  sqlite3CreateFunc(in_RDI,in_RSI,in_EDX,in_ECX,in_R8,in_R9,in_stack_00000020,in_stack_00000028,
                    (_func_void_sqlite3_context_ptr *)zFunc8,in_stack_00000038,
                    (FuncDestructor *)xSFunc);
  sqlite3DbFree(in_stack_00000010,in_stack_00000008);
  iVar1 = sqlite3ApiExit(in_stack_00000008,0);
  sqlite3_mutex_leave((sqlite3_mutex *)0x14b966);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_create_function16(
  sqlite3 *db,
  const void *zFunctionName,
  int nArg,
  int eTextRep,
  void *p,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**),
  void (*xStep)(sqlite3_context*,int,sqlite3_value**),
  void (*xFinal)(sqlite3_context*)
){
  int rc;
  char *zFunc8;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zFunctionName==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  assert( !db->mallocFailed );
  zFunc8 = sqlite3Utf16to8(db, zFunctionName, -1, SQLITE_UTF16NATIVE);
  rc = sqlite3CreateFunc(db, zFunc8, nArg, eTextRep, p, xSFunc,xStep,xFinal,0,0,0);
  sqlite3DbFree(db, zFunc8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}